

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

LoopBlocks * __thiscall spv::Builder::makeNewLoop(Builder *this)

{
  iterator *piVar1;
  Block *pBVar2;
  Block *pBVar3;
  Block *pBVar4;
  _Elt_pointer pLVar5;
  LoopBlocks blocks;
  LoopBlocks local_40;
  
  pBVar2 = makeNewBlock(this);
  pBVar3 = makeNewBlock(this);
  pBVar4 = makeNewBlock(this);
  local_40.continue_target = makeNewBlock(this);
  pLVar5 = (this->loops).c.
           super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pLVar5 == (this->loops).c.
                super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_40.head = pBVar2;
    local_40.body = pBVar3;
    local_40.merge = pBVar4;
    std::deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>>::
    _M_push_back_aux<spv::Builder::LoopBlocks_const&>
              ((deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>> *)
               &this->loops,&local_40);
  }
  else {
    pLVar5->merge = pBVar4;
    pLVar5->continue_target = local_40.continue_target;
    pLVar5->head = pBVar2;
    pLVar5->body = pBVar3;
    piVar1 = &(this->loops).c.
              super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pLVar5 = (this->loops).c.
           super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pLVar5 == (this->loops).c.
                super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pLVar5 = (this->loops).c.
             super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  return pLVar5 + -1;
}

Assistant:

Builder::LoopBlocks& Builder::makeNewLoop()
{
    // This verbosity is needed to simultaneously get the same behavior
    // everywhere (id's in the same order), have a syntax that works
    // across lots of versions of C++, have no warnings from pedantic
    // compilation modes, and leave the rest of the code alone.
    Block& head            = makeNewBlock();
    Block& body            = makeNewBlock();
    Block& merge           = makeNewBlock();
    Block& continue_target = makeNewBlock();
    LoopBlocks blocks(head, body, merge, continue_target);
    loops.push(blocks);
    return loops.top();
}